

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O0

char * crnlib::pixel_format_helpers::get_pixel_format_string(pixel_format fmt)

{
  pixel_format fmt_local;
  char *local_8;
  
  if (fmt == PIXEL_FMT_INVALID) {
    local_8 = "INVALID";
  }
  else if (fmt == PIXEL_FMT_ETC1) {
    local_8 = "ETC1";
  }
  else if (fmt == PIXEL_FMT_DXT5A) {
    local_8 = "DXT5A";
  }
  else if (fmt == PIXEL_FMT_DXT1) {
    local_8 = "DXT1";
  }
  else if (fmt == PIXEL_FMT_ETC2) {
    local_8 = "ETC2";
  }
  else if (fmt == PIXEL_FMT_3DC) {
    local_8 = "3DC";
  }
  else if (fmt == PIXEL_FMT_DXT2) {
    local_8 = "DXT2";
  }
  else if (fmt == PIXEL_FMT_DXT3) {
    local_8 = "DXT3";
  }
  else if (fmt == PIXEL_FMT_DXT4) {
    local_8 = "DXT4";
  }
  else if (fmt == PIXEL_FMT_DXT5) {
    local_8 = "DXT5";
  }
  else if (fmt == PIXEL_FMT_DXT1A) {
    local_8 = "DXT1A";
  }
  else if (fmt == PIXEL_FMT_ETC2A) {
    local_8 = "ETC2A";
  }
  else if (fmt == PIXEL_FMT_A8R8G8B8) {
    local_8 = "A8R8G8B8";
  }
  else if (fmt == PIXEL_FMT_A8L8) {
    local_8 = "A8L8";
  }
  else if (fmt == PIXEL_FMT_A8) {
    local_8 = "A8";
  }
  else if (fmt == PIXEL_FMT_DXT5_AGBR) {
    local_8 = "DXT5_AGBR";
  }
  else if (fmt == PIXEL_FMT_DXT5_xGBR) {
    local_8 = "DXT5_xGBR";
  }
  else if (fmt == PIXEL_FMT_DXT5_xGxR) {
    local_8 = "DXT5_xGxR";
  }
  else if (fmt == PIXEL_FMT_ETC1S) {
    local_8 = "ETC1S";
  }
  else if (fmt == PIXEL_FMT_ETC2AS) {
    local_8 = "ETC2AS";
  }
  else if (fmt == PIXEL_FMT_DXN) {
    local_8 = "DXN";
  }
  else if (fmt == PIXEL_FMT_DXT5_CCxY) {
    local_8 = "DXT5_CCxY";
  }
  else if (fmt == PIXEL_FMT_R8G8B8) {
    local_8 = "R8G8B8";
  }
  else if (fmt == PIXEL_FMT_L8) {
    local_8 = "L8";
  }
  else {
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* get_pixel_format_string(pixel_format fmt) {
  switch (fmt) {
    case PIXEL_FMT_INVALID:
      return "INVALID";
    case PIXEL_FMT_DXT1:
      return "DXT1";
    case PIXEL_FMT_DXT1A:
      return "DXT1A";
    case PIXEL_FMT_DXT2:
      return "DXT2";
    case PIXEL_FMT_DXT3:
      return "DXT3";
    case PIXEL_FMT_DXT4:
      return "DXT4";
    case PIXEL_FMT_DXT5:
      return "DXT5";
    case PIXEL_FMT_3DC:
      return "3DC";
    case PIXEL_FMT_DXN:
      return "DXN";
    case PIXEL_FMT_DXT5A:
      return "DXT5A";
    case PIXEL_FMT_DXT5_CCxY:
      return "DXT5_CCxY";
    case PIXEL_FMT_DXT5_xGxR:
      return "DXT5_xGxR";
    case PIXEL_FMT_DXT5_xGBR:
      return "DXT5_xGBR";
    case PIXEL_FMT_DXT5_AGBR:
      return "DXT5_AGBR";
    case PIXEL_FMT_ETC1:
      return "ETC1";
    case PIXEL_FMT_ETC2:
      return "ETC2";
    case PIXEL_FMT_ETC2A:
      return "ETC2A";
    case PIXEL_FMT_ETC1S:
      return "ETC1S";
    case PIXEL_FMT_ETC2AS:
      return "ETC2AS";
    case PIXEL_FMT_R8G8B8:
      return "R8G8B8";
    case PIXEL_FMT_A8R8G8B8:
      return "A8R8G8B8";
    case PIXEL_FMT_A8:
      return "A8";
    case PIXEL_FMT_L8:
      return "L8";
    case PIXEL_FMT_A8L8:
      return "A8L8";
    default:
      break;
  }
  CRNLIB_ASSERT(false);
  return "?";
}